

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtsp_connect(Curl_easy *data,_Bool *done)

{
  CURLcode CVar1;
  CURLcode httpStatus;
  _Bool *done_local;
  Curl_easy *data_local;
  
  CVar1 = Curl_http_connect(data,done);
  if ((data->state).rtsp_next_client_CSeq == 0) {
    (data->state).rtsp_next_client_CSeq = 1;
  }
  if ((data->state).rtsp_next_server_CSeq == 0) {
    (data->state).rtsp_next_server_CSeq = 1;
  }
  (data->conn->proto).rtspc.rtp_channel = -1;
  return CVar1;
}

Assistant:

static CURLcode rtsp_connect(struct Curl_easy *data, bool *done)
{
  CURLcode httpStatus;

  httpStatus = Curl_http_connect(data, done);

  /* Initialize the CSeq if not already done */
  if(data->state.rtsp_next_client_CSeq == 0)
    data->state.rtsp_next_client_CSeq = 1;
  if(data->state.rtsp_next_server_CSeq == 0)
    data->state.rtsp_next_server_CSeq = 1;

  data->conn->proto.rtspc.rtp_channel = -1;

  return httpStatus;
}